

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsIterationDynamicSlices(void)

{
  int *piVar1;
  pointer ptVar2;
  ostream *poVar3;
  pointer ptVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  initializer_list<int> __l;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> local_68;
  Span<const_int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> values;
  
  local_68.m_begin.m_ptr = (pointer)0x200000001;
  local_68.m_begin.m_stride = 0x400000003;
  local_68.m_end.m_ptr = (pointer)0x600000005;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,(allocator_type *)&span);
  span.m_ptr = (pointer)0x0;
  if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.m_ptr = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  }
  span.m_size.m_size =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices(&local_68,&span,3);
  ptVar2 = local_68.m_begin.m_ptr;
  iVar8 = 0;
  while ((ptVar4 = ptVar2, ptVar4 != local_68.m_end.m_ptr ||
         (local_68.m_begin.m_stride != local_68.m_end.m_stride))) {
    if (local_68.m_begin.m_stride != 3) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x261);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(row.Size()) == (size_t(3))");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_00177809;
    }
    iVar5 = iVar8 + 3;
    lVar6 = 0;
    iVar7 = iVar8;
    while (ptVar2 = ptVar4 + 3, iVar8 = iVar5, lVar6 != 0xc) {
      piVar1 = (int *)((long)ptVar4 + lVar6);
      iVar8 = iVar7 + 1;
      lVar6 = lVar6 + 4;
      iVar7 = *piVar1;
      if (*piVar1 != iVar8) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x264);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(i) == (++counter)");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar3);
        goto LAB_00177809;
      }
    }
  }
  iVar7 = 0;
  if (iVar8 != 6) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x267);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"(counter) == (6)");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar3);
LAB_00177809:
    iVar7 = 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return iVar7;
}

Assistant:

int testSpanTestsIterationDynamicSlices()
{
    const std::vector<int> values = {1, 2, 3, 4, 5, 6};
    auto span = MakeSpan(values);

    // iterate 3 values at a time
    int counter = 0;
    for (auto row : span.IterateSlices(3)) {
        ML_ASSERT_EQ(row.Size(), size_t(3));

        for (auto i : row) {
            ML_ASSERT_EQ(i, ++counter);
        }
    }
    ML_ASSERT_EQ(counter, 6);

    return 0;
}